

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasuEigen.cpp
# Opt level: O0

void test_Eigen<_1,_1>(int M)

{
  Scalar *pSVar1;
  ostream *poVar2;
  rep rVar3;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a0;
  duration<double,_std::ratio<1L,_1L>_> local_98;
  double local_90;
  double elap_us;
  time_point endTime;
  double v;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_70;
  int i_1;
  time_point startTime;
  double y;
  double x;
  double r;
  int local_48;
  int N;
  int j;
  int i;
  undefined1 local_28 [8];
  MatType aa;
  int M_local;
  
  aa.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ = M;
  Eigen::Array<double,_-1,_-1,_0,_-1,_-1>::Array((Array<double,__1,__1,_0,__1,__1> *)local_28);
  Eigen::PlainObjectBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_> *)local_28,
             (long)(aa.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols._4_4_ + 1),
             (long)(aa.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols._4_4_ + 1));
  _j = 0.0;
  Eigen::DenseBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>::fill
            ((DenseBase<Eigen::Array<double,__1,__1,_0,__1,__1>_> *)local_28,(Scalar *)&j);
  for (N = 0; N < aa.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols._4_4_ + 1; N = N + 1) {
    for (local_48 = 0;
        local_48 <
        aa.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ +
        1; local_48 = local_48 + 1) {
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Array<double,__1,__1,_0,__1,__1>,_1> *)local_28,
                          (long)N,(long)local_48);
      *pSVar1 = (double)(N + local_48);
    }
  }
  x = 0.0;
  startTime.__d.__r = (duration)0x3fe6666666666666;
  tStack_70.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  for (v._4_4_ = 0; v._4_4_ < 1000000; v._4_4_ = v._4_4_ + 1) {
    endTime.__d.__r =
         (duration)
         Clenshaw2DEigen<Eigen::Array<double,_1,_1,0,_1,_1>>
                   ((Array<double,__1,__1,_0,__1,__1> *)local_28,0.1,(double)startTime.__d.__r);
    x = x + (double)endTime.__d.__r;
  }
  elap_us = (double)std::chrono::_V2::system_clock::now();
  local_a0.__r = (rep_conflict)
                 std::chrono::operator-
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&elap_us,&stack0xffffffffffffff90);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_98,&local_a0);
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_98);
  local_90 = (rVar3 / 1000000.0) * 1000000.0;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_90);
  poVar2 = std::operator<<(poVar2," us/call. (Eigen-powered) value:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,x / 1000000.0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Eigen::Array<double,_-1,_-1,_0,_-1,_-1>::~Array((Array<double,__1,__1,_0,__1,__1> *)local_28);
  return;
}

Assistant:

void test_Eigen(int M){
    using MatType = Eigen::Array<double, Rows, Cols>;
    MatType aa; 
    if constexpr ((Rows < 0) || (Cols < 0)) {
        aa.resize(M + 1, M + 1);
    }
    else{
        aa.resize(M + 1, M + 1);
    }
    aa.fill(0.0);
    for (auto i = 0; i < M + 1; ++i) {
        for (auto j = 0; j < M + 1; ++j) {
            aa(i, j) = i + j;
        }
    }
    int N = 1000 * 1000;
    volatile auto r = 0.0, x = 0.1, y = 0.7;
    auto startTime = std::chrono::system_clock::now();
    for (int i = 0; i < N; ++i) {
        auto v = Clenshaw2DEigen(aa, x, y);
        r += v;
    }
    auto endTime = std::chrono::system_clock::now();
    auto elap_us = std::chrono::duration<double>(endTime - startTime).count() / N * 1e6;
    std::cout << elap_us << " us/call. (Eigen-powered) value:" << (r / N) << std::endl;
}